

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O0

string * __thiscall
Disa::Matrix_Sparse::range_column_abi_cxx11_(string *__return_storage_ptr__,Matrix_Sparse *this)

{
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Matrix_Sparse *local_18;
  Matrix_Sparse *this_local;
  
  local_18 = this;
  this_local = (Matrix_Sparse *)__return_storage_ptr__;
  std::__cxx11::to_string(&local_58,this->column_size);
  std::operator+(&local_38,"[0, ",&local_58);
  std::operator+(__return_storage_ptr__,&local_38,")");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string range_column() const { return "[0, " + std::to_string(column_size) + ")"; }